

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImVec2 *pIVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined4 uVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImGuiTable *pIVar7;
  ImGuiTableTempData *pIVar8;
  ImGuiTableInstanceData *__src;
  ImGuiWindow *pIVar9;
  float *__src_00;
  void *pvVar10;
  ImGuiTableColumn *pIVar11;
  char *__src_01;
  ImGuiContext *pIVar12;
  void *pvVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  ImU32 IVar17;
  ImGuiTable *table;
  ImGuiTableTempData *pIVar18;
  ImGuiTableInstanceData *__dest;
  ImRect *pIVar19;
  float *__dest_00;
  void *ptr;
  ulong uVar20;
  char *__dest_01;
  int iVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  ImGuiContext *g;
  ImGuiTableColumn *pIVar28;
  undefined4 *puVar29;
  undefined8 *puVar30;
  int iVar31;
  byte bVar32;
  undefined4 in_XMM0_Db;
  ImVec2 IVar33;
  undefined8 extraout_XMM0_Qb;
  ImVec2 IVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  ImRect outer_rect;
  ImRect local_d8;
  undefined8 local_c8;
  char *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImDrawListSplitter local_98;
  undefined3 uStack_80;
  undefined5 uStack_7d;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined3 uStack_70;
  undefined5 uStack_6d;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar12 = GImGui;
  bVar32 = 0;
  local_c8 = (ImGuiWindow *)CONCAT44(in_XMM0_Db,inner_width);
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar6 = pIVar12->CurrentWindow;
  if (pIVar6->SkipItems != false) {
    return false;
  }
  local_b0 = name;
  IVar33 = GetContentRegionAvail();
  fVar37 = IVar33.y;
  auVar36._8_4_ = (int)extraout_XMM0_Qb;
  auVar36._0_4_ = IVar33.x;
  auVar36._4_4_ = IVar33.y;
  auVar36._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  if (IVar33.x <= 1.0) {
    auVar36._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar33 = CalcItemSize(*outer_size,auVar36._0_4_,0.0);
    local_d8.Min = (pIVar6->DC).CursorPos;
    local_d8.Max.x = IVar33.x + local_d8.Min.x;
    local_d8.Max.y = IVar33.y + local_d8.Min.y;
  }
  else {
    if (fVar37 <= 1.0) {
      fVar37 = 1.0;
    }
    IVar33 = CalcItemSize(*outer_size,auVar36._0_4_,fVar37);
    local_d8.Min = (pIVar6->DC).CursorPos;
    local_d8.Max.x = IVar33.x + local_d8.Min.x;
    local_d8.Max.y = IVar33.y + local_d8.Min.y;
    bVar14 = IsClippedEx(&local_d8,0);
    if (bVar14) {
      local_a8.x = local_d8.Max.x - local_d8.Min.x;
      local_a8.y = local_d8.Max.y - local_d8.Min.y;
      ItemSize(&local_a8,-1.0);
      return false;
    }
  }
  table = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar12->Tables,id);
  iVar21 = 0;
  if (table->LastFrameActive == pIVar12->FrameCount) {
    iVar21 = table->InstanceCurrent + 1;
  }
  uVar5 = table->Flags;
  pIVar7 = (pIVar12->Tables).Buf.Data;
  iVar26 = pIVar12->TablesTempDataStacked;
  iVar23 = (pIVar12->TablesTempData).Size;
  iVar31 = iVar26 + 1;
  pIVar12->TablesTempDataStacked = iVar31;
  if (iVar23 <= iVar26) {
    uStack_a0 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6d = 0;
    local_98._Channels.Data = (ImDrawChannel *)0x0;
    uStack_80 = 0;
    uStack_7d = 0;
    local_98._Current = 0;
    local_98._Count = 0;
    local_98._Channels.Size = 0;
    local_98._Channels.Capacity = 0;
    local_a8.x = 0.0;
    local_a8.y = -1.0;
    iVar27 = (pIVar12->TablesTempData).Capacity;
    if (iVar27 <= iVar26) {
      if (iVar27 == 0) {
        iVar27 = 8;
      }
      else {
        iVar27 = iVar27 / 2 + iVar27;
      }
      if (iVar27 <= iVar31) {
        iVar27 = iVar31;
      }
      pIVar18 = (ImGuiTableTempData *)MemAlloc((long)iVar27 * 0x70);
      pIVar8 = (pIVar12->TablesTempData).Data;
      if (pIVar8 != (ImGuiTableTempData *)0x0) {
        memcpy(pIVar18,pIVar8,(long)(pIVar12->TablesTempData).Size * 0x70);
        MemFree((pIVar12->TablesTempData).Data);
      }
      (pIVar12->TablesTempData).Data = pIVar18;
      (pIVar12->TablesTempData).Capacity = iVar27;
      iVar23 = (pIVar12->TablesTempData).Size;
    }
    if (iVar23 <= iVar26) {
      iVar26 = (iVar26 - iVar23) + 1;
      lVar24 = (long)iVar23 * 0x70;
      do {
        memcpy((void *)((long)&((pIVar12->TablesTempData).Data)->TableIndex + lVar24),&local_a8,0x70
              );
        lVar24 = lVar24 + 0x70;
        iVar26 = iVar26 + -1;
      } while (iVar26 != 0);
    }
    (pIVar12->TablesTempData).Size = iVar31;
    ImDrawListSplitter::ClearFreeMemory(&local_98);
    if (local_98._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_98._Channels.Data);
    }
    iVar31 = pIVar12->TablesTempDataStacked;
  }
  iVar26 = (int)((long)table - (long)pIVar7 >> 3) * 0x7a44c6b;
  pIVar8 = (pIVar12->TablesTempData).Data;
  lVar24 = (long)iVar31;
  table->TempData = pIVar8 + lVar24 + -1;
  pIVar8[lVar24 + -1].TableIndex = iVar26;
  pIVar18 = table->TempData;
  table->DrawSplitter = &pIVar18->DrawSplitter;
  (pIVar18->DrawSplitter)._Current = 0;
  (pIVar18->DrawSplitter)._Count = 1;
  uVar15 = flags & 0xe000;
  table->IsDefaultSizingPolicy = uVar15 == 0;
  uVar22 = flags;
  if (uVar15 == 0) {
    uVar15 = 0x2000;
    if ((((uint)flags >> 0x18 & 1) == 0) && (uVar15 = 0x2000, (pIVar6->Flags & 0x40) == 0)) {
      uVar15 = 0x8000;
    }
    uVar22 = uVar15 | flags;
  }
  uVar16 = uVar22 | 0x40000;
  if (uVar15 != 0x4000) {
    uVar16 = uVar22;
  }
  uVar22 = uVar16 & 0xfffcffff;
  if ((uVar16 & 0x3000000) == 0) {
    uVar22 = uVar16;
  }
  uVar15 = uVar22 & 0xfffff7ff;
  if ((uVar22 >> 0xc & 1) == 0) {
    uVar15 = uVar22;
  }
  uVar22 = (uVar16 & 1) << 9 | uVar15;
  uVar16 = uVar22 | 0x10;
  if ((uVar15 & 0xf) == 0) {
    uVar22 = uVar16;
  }
  if (((uint)pIVar6->RootWindow->Flags >> 8 & 1) != 0) {
    uVar22 = uVar16;
  }
  table->ID = id;
  table->Flags = uVar22;
  table->InstanceCurrent = (ImS16)iVar21;
  table->LastFrameActive = pIVar12->FrameCount;
  table->InnerWindow = pIVar6;
  table->OuterWindow = pIVar6;
  table->ColumnsCount = columns_count;
  table->IsLayoutLocked = false;
  table->InnerWidth = (float)local_c8;
  pIVar8[lVar24 + -1].UserOuterSize = *outer_size;
  if ((0 < iVar21) && (iVar31 = (table->InstanceDataExtra).Size, iVar31 < iVar21)) {
    if (iVar31 == (table->InstanceDataExtra).Capacity) {
      if (iVar31 == 0) {
        iVar23 = 8;
      }
      else {
        iVar23 = iVar31 / 2 + iVar31;
      }
      iVar27 = iVar31 + 1;
      if (iVar31 + 1 < iVar23) {
        iVar27 = iVar23;
      }
      __dest = (ImGuiTableInstanceData *)MemAlloc((long)iVar27 << 3);
      __src = (table->InstanceDataExtra).Data;
      if (__src != (ImGuiTableInstanceData *)0x0) {
        memcpy(__dest,__src,(long)(table->InstanceDataExtra).Size << 3);
        MemFree((table->InstanceDataExtra).Data);
      }
      (table->InstanceDataExtra).Data = __dest;
      (table->InstanceDataExtra).Capacity = iVar27;
      iVar31 = (table->InstanceDataExtra).Size;
    }
    else {
      __dest = (table->InstanceDataExtra).Data;
    }
    __dest[iVar31].LastOuterHeight = 0.0;
    __dest[iVar31].LastFirstRowHeight = 0.0;
    (table->InstanceDataExtra).Size = (table->InstanceDataExtra).Size + 1;
  }
  if ((flags & 0x3000000U) == 0) {
    pIVar19 = &local_d8;
    (table->InnerRect).Min = local_d8.Min;
    (table->InnerRect).Max = local_d8.Max;
    (table->OuterRect).Min = local_d8.Min;
    (table->OuterRect).Max = local_d8.Max;
    lVar25 = 0x110;
  }
  else {
    fVar37 = (float)local_c8;
    if ((uVar22 & 0x1000000) == 0) {
      fVar37 = 3.4028235e+38;
    }
    fVar37 = (float)(~-(uint)(0.0 < (float)local_c8) & 0x7f7fffff |
                    (uint)fVar37 & -(uint)(0.0 < (float)local_c8));
    if (fVar37 != 3.4028235e+38 || (uVar22 & 0x3000000) == 0x1000000) {
      if ((uVar22 & 0x3000000) == 0x1000000) {
        local_a8.y = 1.1754944e-38;
      }
      else {
        local_a8.y = 0.0;
      }
      local_a8.x = (float)(-(uint)(fVar37 != 3.4028235e+38) & (uint)fVar37);
      SetNextWindowContentSize(&local_a8);
    }
    if ((uVar5 & 0x3000000) == 0) {
      local_a8.x = 0.0;
      local_a8.y = 0.0;
      SetNextWindowScroll(&local_a8);
    }
    local_a8.x = local_d8.Max.x - local_d8.Min.x;
    local_a8.y = local_d8.Max.y - local_d8.Min.y;
    BeginChildEx(local_b0,iVar21 + id,&local_a8,false,(uVar22 & 0x1000000) >> 0xd);
    pIVar9 = pIVar12->CurrentWindow;
    table->InnerWindow = pIVar9;
    IVar33 = (pIVar9->WorkRect).Max;
    (table->WorkRect).Min = (pIVar9->WorkRect).Min;
    (table->WorkRect).Max = IVar33;
    IVar33 = pIVar9->Pos;
    IVar34.x = (pIVar9->Size).x + IVar33.x;
    IVar34.y = (pIVar9->Size).y + IVar33.y;
    (table->OuterRect).Min = IVar33;
    (table->OuterRect).Max = IVar34;
    pIVar19 = &pIVar9->InnerRect;
    lVar25 = 0x100;
  }
  IVar33 = pIVar19->Max;
  pIVar1 = (ImVec2 *)((long)&table->ID + lVar25);
  *pIVar1 = pIVar19->Min;
  pIVar1[1] = IVar33;
  PushOverrideID(iVar21 + id);
  pIVar9 = table->InnerWindow;
  table->HostIndentX = (pIVar9->DC).Indent.x;
  IVar33 = (pIVar9->ClipRect).Max;
  (table->HostClipRect).Min = (pIVar9->ClipRect).Min;
  (table->HostClipRect).Max = IVar33;
  table->HostSkipItems = pIVar9->SkipItems;
  IVar33 = (pIVar9->WorkRect).Max;
  pIVar8[lVar24 + -1].HostBackupWorkRect.Min = (pIVar9->WorkRect).Min;
  pIVar8[lVar24 + -1].HostBackupWorkRect.Max = IVar33;
  IVar33 = (pIVar9->ParentWorkRect).Max;
  pIVar8[lVar24 + -1].HostBackupParentWorkRect.Min = (pIVar9->ParentWorkRect).Min;
  pIVar8[lVar24 + -1].HostBackupParentWorkRect.Max = IVar33;
  pIVar8[lVar24 + -1].HostBackupColumnsOffset.x = (pIVar6->DC).ColumnsOffset.x;
  pIVar8[lVar24 + -1].HostBackupPrevLineSize = (pIVar9->DC).PrevLineSize;
  pIVar8[lVar24 + -1].HostBackupCurrLineSize = (pIVar9->DC).CurrLineSize;
  pIVar8[lVar24 + -1].HostBackupCursorMaxPos = (pIVar9->DC).CursorMaxPos;
  pIVar8[lVar24 + -1].HostBackupItemWidth = (pIVar6->DC).ItemWidth;
  pIVar8[lVar24 + -1].HostBackupItemWidthStackSize = (pIVar6->DC).ItemWidthStack.Size;
  fVar37 = 0.0;
  fVar39 = 0.0;
  if ((uVar22 >> 9 & 1) != 0) {
    fVar39 = 1.0;
  }
  (pIVar9->DC).CurrLineSize.x = 0.0;
  (pIVar9->DC).CurrLineSize.y = 0.0;
  (pIVar9->DC).PrevLineSize.x = 0.0;
  (pIVar9->DC).PrevLineSize.y = 0.0;
  if ((uVar22 & 0x800200) == 0x200) {
    fVar37 = (pIVar12->Style).CellPadding.x;
LAB_0022e56b:
    fVar38 = 0.0;
  }
  else {
    if ((uVar22 & 0x800200) != 0) goto LAB_0022e56b;
    fVar38 = (pIVar12->Style).CellPadding.x;
  }
  table->CellSpacingX1 = fVar39 + fVar38;
  table->CellSpacingX2 = fVar38;
  table->CellPaddingX = fVar37;
  table->CellPaddingY = (pIVar12->Style).CellPadding.y;
  fVar39 = 0.0;
  fVar38 = 0.0;
  if ((uVar22 >> 10 & 1) != 0) {
    fVar38 = 1.0;
  }
  if ((uVar22 >> 0x16 & 1) == 0 && (uVar22 & 0x200400) != 0) {
    fVar39 = (pIVar12->Style).CellPadding.x;
  }
  table->OuterPaddingX = (fVar38 + fVar39) - fVar37;
  table->CurrentRow = -1;
  table->CurrentColumn = -1;
  table->RowBgColorCounter = 0;
  *(uint *)&table->field_0x98 = (uint)*(ushort *)&table->field_0x98;
  pIVar19 = &pIVar9->ClipRect;
  if (pIVar9 == pIVar6) {
    pIVar19 = &table->WorkRect;
  }
  IVar33 = pIVar19->Max;
  (table->InnerClipRect).Min = pIVar19->Min;
  (table->InnerClipRect).Max = IVar33;
  IVar33 = (table->InnerClipRect).Min;
  auVar35._8_8_ = 0;
  auVar35._0_4_ = (table->InnerClipRect).Max.x;
  auVar35._4_4_ = (table->InnerClipRect).Max.y;
  IVar34 = (table->WorkRect).Min;
  fVar38 = IVar34.x;
  fVar40 = IVar34.y;
  auVar41._8_8_ = 0;
  auVar41._0_4_ = (table->WorkRect).Max.x;
  auVar41._4_4_ = (table->WorkRect).Max.y;
  auVar36 = minps(auVar35,auVar41);
  fVar37 = IVar33.x;
  fVar39 = IVar33.y;
  uVar15 = -(uint)(fVar38 <= fVar37);
  uVar16 = -(uint)(fVar40 <= fVar39);
  (table->InnerClipRect).Min =
       (ImVec2)(CONCAT44(~uVar16 & (uint)fVar40,~uVar15 & (uint)fVar38) |
               CONCAT44((uint)fVar39 & uVar16,(uint)fVar37 & uVar15));
  (table->InnerClipRect).Max = auVar36._0_8_;
  ImRect::ClipWithFull(&table->InnerClipRect,&table->HostClipRect);
  if ((uVar22 >> 0x11 & 1) == 0) {
    fVar37 = (pIVar9->ClipRect).Max.y;
  }
  else {
    fVar37 = (table->InnerClipRect).Max.y;
    fVar39 = (pIVar9->WorkRect).Max.y;
    if (fVar39 <= fVar37) {
      fVar37 = fVar39;
    }
  }
  (table->InnerClipRect).Max.y = fVar37;
  fVar37 = (table->WorkRect).Min.y;
  table->RowPosY2 = fVar37;
  table->RowPosY1 = fVar37;
  table->RowTextBaseline = 0.0;
  table->FreezeRowsRequest = '\0';
  table->FreezeRowsCount = '\0';
  table->FreezeColumnsRequest = '\0';
  table->FreezeColumnsCount = '\0';
  table->IsUnfrozenRows = true;
  table->DeclColumnsCount = '\0';
  IVar17 = GetColorU32(0x2b,1.0);
  table->BorderColorStrong = IVar17;
  IVar17 = GetColorU32(0x2c,1.0);
  table->BorderColorLight = IVar17;
  pIVar12->CurrentTable = table;
  (pIVar6->DC).CurrentTableIdx = iVar26;
  if (pIVar9 != pIVar6) {
    (pIVar9->DC).CurrentTableIdx = iVar26;
  }
  if (((uVar5 & 2) != 0) && ((uVar22 & 2) == 0)) {
    table->IsResetDisplayOrderRequest = true;
  }
  iVar21 = (pIVar12->TablesLastTimeActive).Size;
  local_c8 = pIVar9;
  if (iVar21 <= iVar26) {
    iVar23 = iVar26 + 1;
    iVar31 = (pIVar12->TablesLastTimeActive).Capacity;
    if (iVar31 <= iVar26) {
      if (iVar31 == 0) {
        iVar31 = 8;
      }
      else {
        iVar31 = iVar31 / 2 + iVar31;
      }
      if (iVar31 <= iVar23) {
        iVar31 = iVar23;
      }
      __dest_00 = (float *)MemAlloc((long)iVar31 << 2);
      __src_00 = (pIVar12->TablesLastTimeActive).Data;
      if (__src_00 != (float *)0x0) {
        memcpy(__dest_00,__src_00,(long)(pIVar12->TablesLastTimeActive).Size << 2);
        MemFree((pIVar12->TablesLastTimeActive).Data);
      }
      (pIVar12->TablesLastTimeActive).Data = __dest_00;
      (pIVar12->TablesLastTimeActive).Capacity = iVar31;
      iVar21 = (pIVar12->TablesLastTimeActive).Size;
    }
    if (iVar21 <= iVar26) {
      lVar25 = (long)iVar21;
      iVar21 = (iVar26 - iVar21) + 1;
      do {
        (pIVar12->TablesLastTimeActive).Data[lVar25] = -1.0;
        lVar25 = lVar25 + 1;
        iVar21 = iVar21 + -1;
      } while (iVar21 != 0);
    }
    (pIVar12->TablesLastTimeActive).Size = iVar23;
  }
  (pIVar12->TablesLastTimeActive).Data[iVar26] = (float)pIVar12->Time;
  pIVar8[lVar24 + -1].LastTimeActive = (float)pIVar12->Time;
  table->MemoryCompacted = false;
  pvVar10 = table->RawData;
  pIVar28 = (table->Columns).Data;
  iVar21 = (int)((long)(table->Columns).DataEnd - (long)pIVar28 >> 3) * -0x3b13b13b;
  if (iVar21 == columns_count || iVar21 == 0) {
    pIVar28 = (ImGuiTableColumn *)0x0;
    ptr = (void *)0x0;
    pvVar13 = (void *)0x0;
    if (pvVar10 == (void *)0x0) goto LAB_0022e8a8;
  }
  else {
    table->RawData = (void *)0x0;
    pvVar13 = pvVar10;
LAB_0022e8a8:
    ptr = pvVar13;
    TableBeginInitMemory(table,columns_count);
    table->IsSettingsRequestLoad = true;
    table->IsInitializing = true;
  }
  if (table->IsResetAllRequest == true) {
    table->IsInitializing = true;
    table->IsResetAllRequest = false;
    table->IsSettingsRequestLoad = false;
    table->IsSettingsDirty = true;
    table->SettingsLoadedFlags = 0;
  }
  else if ((table->IsInitializing & 1U) == 0) goto LAB_0022ea6f;
  table->SettingsOffset = -1;
  table->IsSortSpecsDirty = true;
  table->InstanceInteracted = -1;
  table->ContextPopupColumn = -1;
  table->ReorderColumn = -1;
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  table->AutoFitSingleColumn = -1;
  table->ResizedColumn = -1;
  table->LastResizedColumn = -1;
  if (0 < columns_count) {
    lVar24 = 0x66;
    uVar20 = 0;
    do {
      pIVar11 = (table->Columns).Data;
      puVar2 = (undefined1 *)((long)&pIVar11->Flags + lVar24);
      if ((pIVar28 == (ImGuiTableColumn *)0x0) || ((long)iVar21 <= (long)uVar20)) {
        uVar4 = *(undefined4 *)((long)pIVar11 + lVar24 + -0x52);
        local_98._Channels.Data = (ImDrawChannel *)0x0;
        uStack_80 = 0;
        uStack_7d = 0;
        local_98._Current = 0;
        local_98._Count = 0;
        local_98._Channels.Size = 0;
        local_98._Channels.Capacity = 0;
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        uStack_a0 = 0;
        local_78 = 0;
        uStack_70 = 0xffffff;
        uStack_74 = 0xffffffff;
        *(undefined8 *)(puVar2 + -0x66) = 0;
        *(undefined8 *)(puVar2 + -0x5e) = 0;
        *(undefined4 *)((long)pIVar11 + lVar24 + -0x56) = 0xbf800000;
        *(undefined4 *)((long)pIVar11 + lVar24 + -0x4e) = 0xbf800000;
        puVar30 = (undefined8 *)((long)pIVar11 + lVar24 + -0x4a);
        *puVar30 = 0;
        puVar30[1] = 0;
        puVar30 = (undefined8 *)((long)pIVar11 + lVar24 + -0x3a);
        *puVar30 = 0;
        puVar30[1] = 0;
        puVar30 = (undefined8 *)((long)pIVar11 + lVar24 + -0x2a);
        *puVar30 = 0;
        puVar30[1] = 0;
        puVar30 = (undefined8 *)((long)pIVar11 + lVar24 + -0x1f);
        *puVar30 = 0;
        puVar30[1] = 0xffffffffffffff00;
        *(undefined8 *)((long)pIVar11 + lVar24 + -10) = 0;
        *(undefined2 *)((long)pIVar11 + lVar24 + -2) = 0;
        *(undefined1 *)((long)&pIVar11->Flags + lVar24) = 0;
        *(undefined4 *)((long)pIVar11 + lVar24 + -0x52) = uVar4;
        *(undefined1 *)((long)pIVar11 + lVar24 + -5) = 1;
        *(undefined2 *)((long)pIVar11 + lVar24 + -0xb) = 0x101;
        *(undefined4 *)((long)pIVar11 + lVar24 + -0xf) = 0x1ffffff;
      }
      else {
        puVar3 = (undefined1 *)((long)&pIVar28->Flags + lVar24);
        puVar29 = (undefined4 *)(puVar3 + -0x66);
        puVar30 = (undefined8 *)(puVar2 + -0x66);
        for (lVar25 = 0x19; lVar25 != 0; lVar25 = lVar25 + -1) {
          *(undefined4 *)puVar30 = *puVar29;
          puVar29 = puVar29 + (ulong)bVar32 * -2 + 1;
          puVar30 = (undefined8 *)((long)puVar30 + (ulong)bVar32 * -8 + 4);
        }
        *puVar2 = *puVar3;
        *(undefined2 *)(puVar2 + -2) = *(undefined2 *)(puVar3 + -2);
      }
      (table->DisplayOrderToIndex).Data[uVar20] = (char)uVar20;
      *(char *)((long)pIVar11 + lVar24 + -0x14) = (char)uVar20;
      uVar20 = uVar20 + 1;
      lVar24 = lVar24 + 0x68;
    } while ((uint)columns_count != uVar20);
  }
LAB_0022ea6f:
  if (ptr != (void *)0x0) {
    MemFree(ptr);
  }
  if (table->IsSettingsRequestLoad == true) {
    TableLoadSettings(table);
  }
  fVar37 = pIVar12->FontSize;
  fVar39 = table->RefScale;
  if ((fVar39 != 0.0) || (NAN(fVar39))) {
    if (((fVar39 != fVar37) || (NAN(fVar39) || NAN(fVar37))) && (0 < columns_count)) {
      lVar24 = 0;
      do {
        pIVar28 = (table->Columns).Data;
        *(float *)((long)&pIVar28->WidthRequest + lVar24) =
             *(float *)((long)&pIVar28->WidthRequest + lVar24) * (fVar37 / fVar39);
        lVar24 = lVar24 + 0x68;
      } while ((ulong)(uint)columns_count * 0x68 - lVar24 != 0);
    }
  }
  table->RefScale = fVar37;
  local_c8->SkipItems = true;
  if (0 < (table->ColumnsNames).Buf.Size) {
    if ((table->ColumnsNames).Buf.Capacity < 0) {
      __dest_01 = (char *)MemAlloc(0);
      __src_01 = (table->ColumnsNames).Buf.Data;
      if (__src_01 != (char *)0x0) {
        memcpy(__dest_01,__src_01,(long)(table->ColumnsNames).Buf.Size);
        MemFree((table->ColumnsNames).Buf.Data);
      }
      (table->ColumnsNames).Buf.Data = __dest_01;
      (table->ColumnsNames).Buf.Capacity = 0;
    }
    (table->ColumnsNames).Buf.Size = 0;
  }
  TableBeginApplyRequests(table);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;
    if (instance_no > 0 && table->InstanceDataExtra.Size < instance_no)
        table->InstanceDataExtra.push_back(ImGuiTableInstanceData());

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_PRINT("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}